

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::LE_Detonation_PDU::LE_Detonation_PDU
          (LE_Detonation_PDU *this,Header *H,KDataStream *stream)

{
  LE_Header::LE_Header(&this->super_LE_Header,H);
  (this->super_LE_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__LE_Detonation_PDU_00223460;
  DATA_TYPE::LE_EntityIdentifier::LE_EntityIdentifier(&this->m_TargetID);
  DATA_TYPE::LE_EntityIdentifier::LE_EntityIdentifier(&this->m_MunitionID);
  DATA_TYPE::LE_EntityIdentifier::LE_EntityIdentifier(&this->m_EventID);
  DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::LE_Vector
            (&this->m_LocEntCoord);
  DATA_TYPE::RelativeWorldCoordinates::RelativeWorldCoordinates(&this->m_LocWrldCoord);
  DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::LE_Vector
            (&this->m_Vel);
  DATA_TYPE::LE_EulerAngles::LE_EulerAngles(&this->m_Ori);
  DATA_TYPE::MunitionDescriptor::MunitionDescriptor(&this->m_MunitionDesc);
  (*(this->super_LE_Header).super_Header.super_Header6._vptr_Header6[3])(this,stream,1);
  return;
}

Assistant:

LE_Detonation_PDU::LE_Detonation_PDU(const Header &H, KDataStream &stream) noexcept(false) :
    LE_Header( H )
{
    Decode( stream, true );
}